

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isGatherOffsetsCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int coordZ;
  int iVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec2 local_38;
  
  fVar6 = TexVerifierUtil::computeFloatingPointError(coord->m_data[2],(prec->coordBits).m_data[2]);
  fVar7 = TexVerifierUtil::computeFixedPointError((prec->uvwBits).m_data[2]);
  fVar9 = coord->m_data[2];
  fVar8 = floorf((fVar9 - (fVar7 + fVar6)) + 0.5);
  iVar3 = (int)fVar8;
  iVar1 = texture->m_numLevels;
  iVar4 = -1;
  coordZ = -1;
  if (0 < iVar1) {
    coordZ = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar3 < coordZ) {
    coordZ = iVar3;
  }
  if (iVar3 < 0) {
    coordZ = 0;
  }
  fVar9 = floorf(fVar7 + fVar6 + fVar9 + 0.5);
  iVar3 = (int)fVar9;
  if (0 < iVar1) {
    iVar4 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar3 < iVar4) {
    iVar4 = iVar3;
  }
  if (iVar3 < 0) {
    iVar4 = 0;
  }
  bVar5 = coordZ <= iVar4;
  if (coordZ <= iVar4) {
    local_38.m_data = *(float (*) [2])coord->m_data;
    bVar2 = isGatherOffsetsCompareResultValid
                      (texture->m_levels,sampler,prec,&local_38,coordZ,offsets,cmpReference,result);
    while (!bVar2) {
      coordZ = coordZ + 1;
      bVar5 = coordZ <= iVar4;
      if (iVar4 < coordZ) {
        return bVar5;
      }
      local_38.m_data = *(float (*) [2])coord->m_data;
      bVar2 = isGatherOffsetsCompareResultValid
                        (texture->m_levels,sampler,prec,&local_38,coordZ,offsets,cmpReference,result
                        );
    }
  }
  return bVar5;
}

Assistant:

bool isGatherOffsetsCompareResultValid (const Texture2DArrayView&	texture,
										const Sampler&				sampler,
										const TexComparePrecision&	prec,
										const Vec3&					coord,
										const IVec2					(&offsets)[4],
										float						cmpReference,
										const Vec4&					result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		if (isGatherOffsetsCompareResultValid(texture.getLevel(0), sampler, prec, coord.swizzle(0,1), layer, offsets, cmpReference, result))
			return true;
	}
	return false;
}